

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

int stbi_write_bmp_core(stbi__write_context *s,int x,int y,int comp,void *data)

{
  uint pad_00;
  int pad;
  void *data_local;
  int comp_local;
  int y_local;
  int x_local;
  stbi__write_context *s_local;
  
  if (comp == 4) {
    s_local._4_4_ =
         stbiw__outfile(s,-1,-1,x,y,4,1,data,1,0,"11 4 22 44 44 22 444444 4444 4 444 444 444 444",
                        0x42,0x4d,x * y * 4 + 0x7a,0,0,0x7a,0x6c,x,y,1,0x20,3,0,0,0,0,0,0xff0000,
                        0xff00,0xff,0xff000000,0,0,0,0,0,0,0,0,0,0,0,0,0);
  }
  else {
    pad_00 = x * -3 & 3;
    s_local._4_4_ =
         stbiw__outfile(s,-1,-1,x,y,comp,1,data,0,pad_00,"11 4 22 44 44 22 444444",0x42,0x4d,
                        (x * 3 + pad_00) * y + 0x36,0,0,0x36,0x28,x,y,1,0x18,0,0,0,0,0,0);
  }
  return s_local._4_4_;
}

Assistant:

static int stbi_write_bmp_core(stbi__write_context *s, int x, int y, int comp, const void *data)
{
   if (comp != 4) {
      // write RGB bitmap
      int pad = (-x*3) & 3;
      return stbiw__outfile(s,-1,-1,x,y,comp,1,(void *) data,0,pad,
              "11 4 22 4" "4 44 22 444444",
              'B', 'M', 14+40+(x*3+pad)*y, 0,0, 14+40,  // file header
               40, x,y, 1,24, 0,0,0,0,0,0);             // bitmap header
   } else {
      // RGBA bitmaps need a v4 header
      // use BI_BITFIELDS mode with 32bpp and alpha mask
      // (straight BI_RGB with alpha mask doesn't work in most readers)
      return stbiw__outfile(s,-1,-1,x,y,comp,1,(void *)data,1,0,
         "11 4 22 4" "4 44 22 444444 4444 4 444 444 444 444",
         'B', 'M', 14+108+x*y*4, 0, 0, 14+108, // file header
         108, x,y, 1,32, 3,0,0,0,0,0, 0xff0000,0xff00,0xff,0xff000000u, 0, 0,0,0, 0,0,0, 0,0,0, 0,0,0); // bitmap V4 header
   }
}